

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.cc
# Opt level: O2

void absl::lts_20240722::flags_internal::FlagHelp
               (ostream *out,CommandLineFlag *flag,HelpFormat format)

{
  bool bVar1;
  char *pcVar2;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  undefined1 local_148 [32];
  string dflt_val;
  string curr_val;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  FlagHelpPrettyPrinter printer;
  
  if (format == kHumanReadable) {
    printer.max_line_len_ = 0x50;
    printer.min_line_len_ = 4;
    printer.wrapped_line_indent_ = 2;
    printer.line_len_ = 0;
    printer.first_line_ = true;
    printer.out_ = out;
    local_88.piece_ = NullSafeStringView("--");
    local_b8.piece_ = (string_view)(*(code *)**(undefined8 **)flag)(flag);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_e8,&local_88);
    str._M_str = (char *)local_e8.piece_._M_len;
    str._M_len = (size_t)local_e8.piece_._M_str;
    anon_unknown_0::FlagHelpPrettyPrinter::Write(&printer,str,false);
    std::__cxx11::string::~string((string *)&local_e8);
    local_88.piece_ = NullSafeStringView("(");
    (**(code **)(*(long *)flag + 0x10))(&curr_val,flag);
    local_b8.piece_._M_len = curr_val._M_string_length;
    local_b8.piece_._M_str = curr_val._M_dataplus._M_p;
    local_e8.piece_ = NullSafeStringView(");");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&dflt_val,&local_88,&local_b8);
    str_00._M_str = dflt_val._M_dataplus._M_p;
    str_00._M_len = dflt_val._M_string_length;
    anon_unknown_0::FlagHelpPrettyPrinter::Write(&printer,str_00,true);
    std::__cxx11::string::~string((string *)&dflt_val);
    std::__cxx11::string::~string((string *)&curr_val);
    (**(code **)(*(long *)flag + 0x20))(&dflt_val,flag);
    (**(code **)(*(long *)flag + 0x28))(&curr_val,flag);
    bVar1 = std::operator!=(&curr_val,&dflt_val);
    pcVar2 = (char *)(**(code **)(*(long *)flag + 0x38))(flag);
    if (pcVar2 == "") {
      local_88.piece_ = NullSafeStringView("\"");
      local_b8.piece_._M_len = dflt_val._M_string_length;
      local_b8.piece_._M_str = dflt_val._M_dataplus._M_p;
      local_e8.piece_ = NullSafeStringView("\"");
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_148,&local_88,&local_b8);
      std::__cxx11::string::operator=((string *)&dflt_val,(string *)local_148);
      std::__cxx11::string::~string((string *)local_148);
    }
    local_88.piece_ = NullSafeStringView("default: ");
    local_b8.piece_._M_len = dflt_val._M_string_length;
    local_b8.piece_._M_str = dflt_val._M_dataplus._M_p;
    local_e8.piece_ = NullSafeStringView(";");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_148,&local_88,&local_b8);
    str_01._M_str = (char *)local_148._0_8_;
    str_01._M_len = local_148._8_8_;
    anon_unknown_0::FlagHelpPrettyPrinter::Write(&printer,str_01,false);
    std::__cxx11::string::~string((string *)local_148);
    if (bVar1) {
      pcVar2 = (char *)(**(code **)(*(long *)flag + 0x38))(flag);
      if (pcVar2 == "") {
        local_88.piece_ = NullSafeStringView("\"");
        local_b8.piece_._M_len = curr_val._M_string_length;
        local_b8.piece_._M_str = curr_val._M_dataplus._M_p;
        local_e8.piece_ = NullSafeStringView("\"");
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_148,&local_88,&local_b8);
        std::__cxx11::string::operator=((string *)&curr_val,(string *)local_148);
        std::__cxx11::string::~string((string *)local_148);
      }
      local_88.piece_ = NullSafeStringView("currently: ");
      local_b8.piece_._M_len = curr_val._M_string_length;
      local_b8.piece_._M_str = curr_val._M_dataplus._M_p;
      local_e8.piece_ = NullSafeStringView(";");
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_148,&local_88,&local_b8);
      str_02._M_str = (char *)local_148._0_8_;
      str_02._M_len = local_148._8_8_;
      anon_unknown_0::FlagHelpPrettyPrinter::Write(&printer,str_02,false);
      std::__cxx11::string::~string((string *)local_148);
    }
    anon_unknown_0::FlagHelpPrettyPrinter::EndLine(&printer);
    std::__cxx11::string::~string((string *)&curr_val);
    std::__cxx11::string::~string((string *)&dflt_val);
  }
  return;
}

Assistant:

void FlagHelp(std::ostream& out, const CommandLineFlag& flag,
              HelpFormat format) {
  if (format == HelpFormat::kHumanReadable)
    flags_internal::FlagHelpHumanReadable(flag, out);
}